

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O0

int32_t main(int32_t argc,char **argv)

{
  int iVar1;
  int32_t iVar2;
  BtorSimVCDWriter *pBVar3;
  size_type sVar4;
  reference pvVar5;
  long in_RSI;
  int in_EDI;
  Btor2Parser *in_stack_00000008;
  BtorSimVCDWriter *in_stack_00000010;
  int64_t i_2;
  int64_t i_1;
  int32_t i;
  int32_t s;
  int32_t r;
  int64_t fake_justice;
  int64_t fake_bad;
  char *info_path;
  char *in_stack_00000410;
  BtorSimVCDWriter *in_stack_00000418;
  map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff58;
  map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff60;
  int64_t *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  char *pcVar6;
  BtorSimVCDWriter *in_stack_ffffffffffffff80;
  char *pcVar7;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  char *in_stack_ffffffffffffffa8;
  BtorSimVCDWriter *in_stack_ffffffffffffffb0;
  int local_34;
  long local_28;
  long local_18;
  
  local_18 = 0;
  local_28 = -1;
  local_34 = 1;
  while( true ) {
    if (in_EDI <= local_34) {
      if (model_path == (char *)0x0) {
        model_path = "<stdin>";
        model_file = _stdin;
      }
      else {
        model_file = (FILE *)fopen(model_path,"r");
        if ((FILE *)model_file == (FILE *)0x0) {
          die("failed to open BTOR model file \'%s\' for reading",model_path);
        }
        close_model_file = 1;
      }
      if (witness_path != (char *)0x0) {
        witness_file = (FILE *)fopen(witness_path,"r");
        if ((FILE *)witness_file == (FILE *)0x0) {
          die("failed to open witness file \'%s\' for reading",witness_path);
        }
        close_witness_file = 1;
      }
      if ((model_path == (char *)0x0) || (witness_path == (char *)0x0)) {
        msg(1,"random mode: witness not specified");
        checking_mode = 0;
        random_mode = 1;
      }
      else {
        msg(1,"checking mode: both model and witness specified");
        checking_mode = 1;
        random_mode = 0;
      }
      if ((dump_vcd & 1U) != 0) {
        pBVar3 = (BtorSimVCDWriter *)operator_new(0x2f8);
        BtorSimVCDWriter::BtorSimVCDWriter
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                   (bool)in_stack_ffffffffffffffa7,(bool)in_stack_ffffffffffffffa6);
        vcd_writer = pBVar3;
        if (local_18 != 0) {
          BtorSimVCDWriter::read_info_file_abi_cxx11_(in_stack_00000418,in_stack_00000410);
          std::
          map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          std::
          map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x12f18d);
        }
      }
      msg(1,"reading BTOR model from \'%s\'",model_path);
      parse_model();
      sVar4 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::size(&bads);
      if ((long)sVar4 < 0) {
        die("invalid faked bad state property number %ld",0xffffffffffffffff);
      }
      sVar4 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::size(&justices);
      if ((long)sVar4 <= local_28) {
        die("invalid faked justice property number %ld",0xffffffffffffffff);
      }
      if ((close_model_file != 0) && (iVar1 = fclose((FILE *)model_file), iVar1 != 0)) {
        die("can not close model file \'%s\'",model_path);
      }
      setup_states();
      if (random_mode == 0) {
        msg(1,"reading BTOR witness from \'%s\'",witness_path);
        parse_and_check_all_witnesses();
        if ((close_witness_file != 0) && (iVar1 = fclose((FILE *)witness_file), iVar1 != 0)) {
          die("can not close witness file \'%s\'",witness_path);
        }
      }
      else {
        msg(1,"using random seed %d",0);
        btorsim_rng_init(&rng,0);
        random_simulation(local_28);
      }
      if (((dump_vcd & 1U) != 0) &&
         (BtorSimVCDWriter::write_vcd(in_stack_00000010,in_stack_00000008),
         vcd_writer != (BtorSimVCDWriter *)0x0)) {
        pBVar3 = vcd_writer;
        BtorSimVCDWriter::~BtorSimVCDWriter(in_stack_ffffffffffffff80);
        operator_delete(pBVar3);
      }
      btor2parser_delete(model);
      pcVar7 = (char *)0x0;
      while ((long)pcVar7 < num_format_lines) {
        pvVar5 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                           (&current_state,(size_type)pcVar7);
        pcVar6 = pcVar7;
        if (pvVar5->type != INVALID) {
          pvVar5 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                             (&current_state,(size_type)pcVar7);
          BtorSimState::remove(pvVar5,pcVar7);
        }
        pcVar7 = pcVar6 + 1;
      }
      pcVar7 = (char *)0x0;
      while ((long)pcVar7 < num_format_lines) {
        pvVar5 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                           (&next_state,(size_type)pcVar7);
        pcVar6 = pcVar7;
        if (pvVar5->type != INVALID) {
          pvVar5 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                             (&next_state,(size_type)pcVar7);
          BtorSimState::remove(pvVar5,pcVar7);
        }
        pcVar7 = pcVar6 + 1;
      }
      return 0;
    }
    iVar1 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"-h");
    if (iVar1 == 0) break;
    iVar1 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"-c");
    if (iVar1 == 0) {
      print_trace = false;
    }
    else {
      iVar1 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"-v");
      if (iVar1 == 0) {
        verbosity = verbosity + 1;
      }
      else {
        iVar1 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"-r");
        if (iVar1 == 0) {
          local_34 = local_34 + 1;
          if (local_34 == in_EDI) {
            die("argument to \'-r\' missing");
          }
          iVar2 = parse_int(in_stack_ffffffffffffff78,(int32_t *)in_stack_ffffffffffffff70);
          if (iVar2 == 0) {
            die("invalid number in \'-r %s\'",*(undefined8 *)(in_RSI + (long)local_34 * 8));
          }
        }
        else {
          iVar1 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"-s");
          if (iVar1 == 0) {
            local_34 = local_34 + 1;
            if (local_34 == in_EDI) {
              die("argument to \'-s\' missing");
            }
            iVar2 = parse_int(in_stack_ffffffffffffff78,(int32_t *)in_stack_ffffffffffffff70);
            if (iVar2 == 0) {
              die("invalid number in \'-s %s\'",*(undefined8 *)(in_RSI + (long)local_34 * 8));
            }
          }
          else {
            iVar1 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"-b");
            if (iVar1 == 0) {
              local_34 = local_34 + 1;
              if (local_34 == in_EDI) {
                die("argument to \'-b\' missing");
              }
              iVar2 = parse_long(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
              if (iVar2 == 0) {
                die("invalid number in \'-b %s\'",*(undefined8 *)(in_RSI + (long)local_34 * 8));
              }
            }
            else {
              iVar1 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"-j");
              if (iVar1 == 0) {
                local_34 = local_34 + 1;
                if (local_34 == in_EDI) {
                  die("argument to \'-j\' missing");
                }
                iVar2 = parse_long(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
                if (iVar2 == 0) {
                  die("invalid number in \'-j %s\'",*(undefined8 *)(in_RSI + (long)local_34 * 8));
                }
              }
              else {
                iVar1 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"--states");
                if (iVar1 == 0) {
                  print_states = true;
                }
                else {
                  iVar1 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"--vcd");
                  if (iVar1 == 0) {
                    dump_vcd = true;
                    local_34 = local_34 + 1;
                    if (local_34 == in_EDI) {
                      die("argument to \'--vcd\' missing");
                    }
                    vcd_path = *(char **)(in_RSI + (long)local_34 * 8);
                  }
                  else {
                    iVar1 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"--hierarchical-symbols")
                    ;
                    if (iVar1 == 0) {
                      symbol_fmt = true;
                    }
                    else {
                      iVar1 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),"--info");
                      if (iVar1 == 0) {
                        local_34 = local_34 + 1;
                        if (local_34 == in_EDI) {
                          die("argument to \'--info\' missing");
                        }
                        local_18 = *(long *)(in_RSI + (long)local_34 * 8);
                      }
                      else if (**(char **)(in_RSI + (long)local_34 * 8) == '-') {
                        die("invalid command line option \'%s\' (try \'-h\')",
                            *(undefined8 *)(in_RSI + (long)local_34 * 8));
                      }
                      else if (witness_path == (char *)0x0) {
                        if (model_path == (char *)0x0) {
                          model_path = *(char **)(in_RSI + (long)local_34 * 8);
                        }
                        else {
                          witness_path = *(char **)(in_RSI + (long)local_34 * 8);
                        }
                      }
                      else {
                        die("too many file arguments \'%s\', \'%s\', and \'%s\'",model_path,
                            witness_path,*(undefined8 *)(in_RSI + (long)local_34 * 8));
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_34 = local_34 + 1;
  }
  fputs(usage,_stdout);
  exit(0);
}

Assistant:

int32_t
main (int32_t argc, char const *argv[])
{
  const char *info_path = nullptr;
  int64_t fake_bad = -1, fake_justice = -1;
  int32_t r = -1, s = -1;
  for (int32_t i = 1; i < argc; i++)
  {
    if (!strcmp (argv[i], "-h"))
      fputs (usage, stdout), exit (0);
    else if (!strcmp (argv[i], "-c"))
      print_trace = false;
    else if (!strcmp (argv[i], "-v"))
      verbosity++;
    else if (!strcmp (argv[i], "-r"))
    {
      if (++i == argc) die ("argument to '-r' missing");
      if (!parse_int (argv[i], &r)) die ("invalid number in '-r %s'", argv[i]);
    }
    else if (!strcmp (argv[i], "-s"))
    {
      if (++i == argc) die ("argument to '-s' missing");
      if (!parse_int (argv[i], &s)) die ("invalid number in '-s %s'", argv[i]);
    }
    else if (!strcmp (argv[i], "-b"))
    {
      if (++i == argc) die ("argument to '-b' missing");
      if (!parse_long (argv[i], &fake_bad))
        die ("invalid number in '-b %s'", argv[i]);
    }
    else if (!strcmp (argv[i], "-j"))
    {
      if (++i == argc) die ("argument to '-j' missing");
      if (!parse_long (argv[i], &fake_justice))
        die ("invalid number in '-j %s'", argv[i]);
    }
    else if (!strcmp (argv[i], "--states"))
      print_states = true;
    else if (!strcmp (argv[i], "--vcd"))
    {
      dump_vcd = true;
      if (++i == argc) die ("argument to '--vcd' missing");
      vcd_path = argv[i];
    }
    else if (!strcmp (argv[i], "--hierarchical-symbols"))
      symbol_fmt = true;
    else if (!strcmp (argv[i], "--info"))
    {
      if (++i == argc) die ("argument to '--info' missing");
      info_path = argv[i];
    }
    else if (argv[i][0] == '-')
      die ("invalid command line option '%s' (try '-h')", argv[i]);
    else if (witness_path)
      die ("too many file arguments '%s', '%s', and '%s'",
           model_path,
           witness_path,
           argv[i]);
    else if (model_path)
      witness_path = argv[i];
    else
      model_path = argv[i];
  }
  if (model_path)
  {
    if (!(model_file = fopen (model_path, "r")))
      die ("failed to open BTOR model file '%s' for reading", model_path);
    close_model_file = 1;
  }
  else
  {
    model_path = "<stdin>";
    model_file = stdin;
  }
  if (witness_path)
  {
    if (!(witness_file = fopen (witness_path, "r")))
      die ("failed to open witness file '%s' for reading", witness_path);
    close_witness_file = 1;
  }
  if (model_path && witness_path)
  {
    msg (1, "checking mode: both model and witness specified");
    checking_mode = 1;
    random_mode   = 0;
  }
  else
  {
    msg (1, "random mode: witness not specified");
    checking_mode = 0;
    random_mode   = 1;
  }
  if (checking_mode)
  {
    if (r >= 0)
      die ("number of random test vectors specified in checking mode");
    if (s >= 0) die ("random seed specified in checking mode");
    if (fake_bad >= 0) die ("can not fake bad state property in checking mode");
    if (fake_justice >= 0)
      die ("can not fake justice property in checking mode");
  }
  if (dump_vcd)
  {
    vcd_writer = new BtorSimVCDWriter (vcd_path, readable_vcd, symbol_fmt);
    if (info_path)
    {
      extra_constraints = vcd_writer->read_info_file (info_path);
    }
  }
  assert (model_path);
  msg (1, "reading BTOR model from '%s'", model_path);
  parse_model ();
  if (fake_bad >= (int64_t) bads.size ())
    die ("invalid faked bad state property number %" PRId64, fake_bad);
  if (fake_justice >= (int64_t) justices.size ())
    die ("invalid faked justice property number %" PRId64, fake_justice);
  if (close_model_file && fclose (model_file))
    die ("can not close model file '%s'", model_path);
  setup_states ();
  if (random_mode)
  {
    if (r < 0) r = 20;
    if (s < 0) s = 0;
    msg (1, "using random seed %d", s);
    btorsim_rng_init (&rng, (uint32_t) s);
    if (print_trace)
    {
      if (fake_bad >= 0 && fake_justice >= 0)
        printf ("sat\nb%" PRId64 " j%" PRId64 "\n", fake_bad, fake_justice);
      else if (fake_bad >= 0)
        printf ("sat\nb%" PRId64 "\n", fake_bad);
      else if (fake_justice >= 0)
        printf ("sat\nj%" PRId64 "\n", fake_justice);
    }
    random_simulation (r);
  }
  else
  {
    assert (witness_path);
    msg (1, "reading BTOR witness from '%s'", witness_path);
    parse_and_check_all_witnesses ();
    if (close_witness_file && fclose (witness_file))
      die ("can not close witness file '%s'", witness_path);
  }
  if (dump_vcd)
  {
    vcd_writer->write_vcd (model);
    delete vcd_writer;
  }
  btor2parser_delete (model);
  for (int64_t i = 0; i < num_format_lines; i++)
    if (current_state[i].type) current_state[i].remove ();
  for (int64_t i = 0; i < num_format_lines; i++)
    if (next_state[i].type) next_state[i].remove ();
  return 0;
}